

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::CallsAccessor(Instr *this,PropertySymOpnd *methodOpnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ObjTypeSpecFldInfo *this_00;
  
  if (methodOpnd == (PropertySymOpnd *)0x0) {
    bVar2 = CallsGetter(this);
    if (bVar2) {
      return true;
    }
    bVar2 = CallsSetter(this);
    return bVar2;
  }
  this_00 = methodOpnd->objTypeSpecFldInfo;
  if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe7b,"(methodOpnd->HasObjTypeSpecFldInfo())",
                       "methodOpnd->HasObjTypeSpecFldInfo()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = methodOpnd->objTypeSpecFldInfo;
    if (this_00 == (ObjTypeSpecFldInfo *)0x0) {
      return false;
    }
  }
  bVar2 = ObjTypeSpecFldInfo::UsesAccessor(this_00);
  return bVar2;
}

Assistant:

bool Instr::CallsAccessor(IR::PropertySymOpnd * methodOpnd)
{
    if (methodOpnd)
    {
        Assert(methodOpnd->HasObjTypeSpecFldInfo());
        return methodOpnd->UsesAccessor();
    }

    return CallsGetter() || CallsSetter();
}